

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_arrow_collector.cpp
# Opt level: O3

unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>,_true>
 __thiscall
duckdb::PhysicalArrowCollector::Create
          (PhysicalArrowCollector *this,ClientContext *context,PreparedStatementData *data,
          idx_t batch_size)

{
  bool bVar1;
  pointer pPVar2;
  bool *args_1;
  bool local_32;
  bool local_31;
  idx_t local_30;
  
  local_30 = batch_size;
  pPVar2 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
           operator->(&data->physical_plan);
  optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&pPVar2->root);
  bVar1 = PhysicalPlanGenerator::PreserveInsertionOrder(context,(pPVar2->root).ptr);
  if (bVar1) {
    pPVar2 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
             operator->(&data->physical_plan);
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&pPVar2->root);
    bVar1 = PhysicalPlanGenerator::UseBatchIndex(context,(pPVar2->root).ptr);
    if (bVar1) {
      make_uniq_base<duckdb::PhysicalResultCollector,duckdb::PhysicalArrowBatchCollector,duckdb::PreparedStatementData&,unsigned_long&>
                ((duckdb *)this,data,&local_30);
      return (unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>_>
              )(unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>_>
                )this;
    }
    args_1 = &local_32;
    local_32 = false;
  }
  else {
    args_1 = &local_31;
    local_31 = true;
  }
  make_uniq_base<duckdb::PhysicalResultCollector,duckdb::PhysicalArrowCollector,duckdb::PreparedStatementData&,bool,unsigned_long&>
            ((duckdb *)this,data,args_1,&local_30);
  return (unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>_>
          )(unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>_>
            )this;
}

Assistant:

unique_ptr<PhysicalResultCollector> PhysicalArrowCollector::Create(ClientContext &context, PreparedStatementData &data,
                                                                   idx_t batch_size) {
	if (!PhysicalPlanGenerator::PreserveInsertionOrder(context, data.physical_plan->Root())) {
		// the plan is not order preserving, so we just use the parallel materialized collector
		return make_uniq_base<PhysicalResultCollector, PhysicalArrowCollector>(data, true, batch_size);
	} else if (!PhysicalPlanGenerator::UseBatchIndex(context, data.physical_plan->Root())) {
		// the plan is order preserving, but we cannot use the batch index: use a single-threaded result collector
		return make_uniq_base<PhysicalResultCollector, PhysicalArrowCollector>(data, false, batch_size);
	} else {
		return make_uniq_base<PhysicalResultCollector, PhysicalArrowBatchCollector>(data, batch_size);
	}
}